

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O2

MempoolAcceptResult *
MempoolAcceptResult::FeeFailure
          (MempoolAcceptResult *__return_storage_ptr__,TxValidationState state,
          CFeeRate effective_feerate,
          vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          *wtxids_fee_calculations)

{
  long lVar1;
  long in_FS_OFFSET;
  ValidationState<TxValidationResult> in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ValidationState<TxValidationResult>::ValidationState
            ((ValidationState<TxValidationResult> *)&stack0xffffffffffffff90,
             (ValidationState<TxValidationResult> *)effective_feerate.nSatoshisPerK);
  MempoolAcceptResult(__return_storage_ptr__,(TxValidationState)in_stack_ffffffffffffff88,
                      (CFeeRate)&stack0xffffffffffffff90,wtxids_fee_calculations);
  ValidationState<TxValidationResult>::~ValidationState
            ((ValidationState<TxValidationResult> *)&stack0xffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static MempoolAcceptResult FeeFailure(TxValidationState state,
                                          CFeeRate effective_feerate,
                                          const std::vector<Wtxid>& wtxids_fee_calculations) {
        return MempoolAcceptResult(state, effective_feerate, wtxids_fee_calculations);
    }